

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_Threshold(ThresholdForm2 Threshold)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ImageTemplate<unsigned_char> local_38;
  
  Unit_Test::intensityArray(&local_50,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_38,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&local_68,&local_50,&local_38);
  local_38._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_38);
  uVar3 = rand();
  bVar1 = (char)(uVar3 / 0xff) + (char)uVar3;
  (*Threshold)(local_68.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_68.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,bVar1);
  bVar2 = Unit_Test::verifyImage
                    (local_68.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     (*local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start < bVar1) + 0xff);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_68);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form2_Threshold(ThresholdForm2 Threshold)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const uint8_t threshold = randomValue <uint8_t>( 255 );

        Threshold( input[0], input[1], threshold );

        return verifyImage( input[1], intensity[0] < threshold ? 0 : 255 );
    }